

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV newP11Object(CK_OBJECT_CLASS objClass,CK_KEY_TYPE keyType,CK_CERTIFICATE_TYPE certType,
                  P11Object **p11object)

{
  P11Object *this;
  P11GenericSecretKeyObj *this_00;
  CK_RV CVar1;
  
  CVar1 = 0x13;
  switch(objClass) {
  case 0:
    this = (P11Object *)operator_new(0x48);
    P11DataObj::P11DataObj((P11DataObj *)this);
    break;
  case 1:
    if (certType == 0x80504750) {
      this = (P11Object *)operator_new(0x48);
      P11OpenPGPPublicKeyObj::P11OpenPGPPublicKeyObj((P11OpenPGPPublicKeyObj *)this);
    }
    else {
      if (certType != 0) {
        return 0x13;
      }
      this = (P11Object *)operator_new(0x48);
      P11X509CertificateObj::P11X509CertificateObj((P11X509CertificateObj *)this);
    }
    break;
  case 2:
    switch(keyType) {
    case 0:
      this = (P11Object *)operator_new(0x48);
      P11RSAPublicKeyObj::P11RSAPublicKeyObj((P11RSAPublicKeyObj *)this);
      break;
    case 1:
      this = (P11Object *)operator_new(0x48);
      P11DSAPublicKeyObj::P11DSAPublicKeyObj((P11DSAPublicKeyObj *)this);
      break;
    case 2:
      this = (P11Object *)operator_new(0x48);
      P11DHPublicKeyObj::P11DHPublicKeyObj((P11DHPublicKeyObj *)this);
      break;
    case 3:
      this = (P11Object *)operator_new(0x48);
      P11ECPublicKeyObj::P11ECPublicKeyObj((P11ECPublicKeyObj *)this);
      break;
    default:
      if (keyType == 0x30) {
        this = (P11Object *)operator_new(0x48);
        P11GOSTPublicKeyObj::P11GOSTPublicKeyObj((P11GOSTPublicKeyObj *)this);
      }
      else {
        if (keyType != 0x40) {
          return 0x13;
        }
        this = (P11Object *)operator_new(0x48);
        P11EDPublicKeyObj::P11EDPublicKeyObj((P11EDPublicKeyObj *)this);
      }
    }
    break;
  case 3:
    switch(keyType) {
    case 0:
      this = (P11Object *)operator_new(0x48);
      P11RSAPrivateKeyObj::P11RSAPrivateKeyObj((P11RSAPrivateKeyObj *)this);
      break;
    case 1:
      this = (P11Object *)operator_new(0x48);
      P11DSAPrivateKeyObj::P11DSAPrivateKeyObj((P11DSAPrivateKeyObj *)this);
      break;
    case 2:
      this = (P11Object *)operator_new(0x48);
      P11DHPrivateKeyObj::P11DHPrivateKeyObj((P11DHPrivateKeyObj *)this);
      break;
    case 3:
      this = (P11Object *)operator_new(0x48);
      P11ECPrivateKeyObj::P11ECPrivateKeyObj((P11ECPrivateKeyObj *)this);
      break;
    default:
      if (keyType == 0x30) {
        this = (P11Object *)operator_new(0x48);
        P11GOSTPrivateKeyObj::P11GOSTPrivateKeyObj((P11GOSTPrivateKeyObj *)this);
      }
      else {
        if (keyType != 0x40) {
          return 0x13;
        }
        this = (P11Object *)operator_new(0x48);
        P11EDPrivateKeyObj::P11EDPrivateKeyObj((P11EDPrivateKeyObj *)this);
      }
    }
    break;
  case 4:
    if (keyType < 0x2f) {
      if ((0x798000010000U >> (keyType & 0x3f) & 1) == 0) {
        if (keyType == 0x1f) {
          this = (P11Object *)operator_new(0x48);
          P11AESSecretKeyObj::P11AESSecretKeyObj((P11AESSecretKeyObj *)this);
          break;
        }
        goto LAB_00147e34;
      }
      this_00 = (P11GenericSecretKeyObj *)operator_new(0x50);
      P11GenericSecretKeyObj::P11GenericSecretKeyObj(this_00);
    }
    else {
LAB_00147e34:
      if (2 < keyType - 0x13) {
        if (keyType != 0x32) {
          return 0x13;
        }
        this = (P11Object *)operator_new(0x48);
        P11GOSTSecretKeyObj::P11GOSTSecretKeyObj((P11GOSTSecretKeyObj *)this);
        break;
      }
      this_00 = (P11GenericSecretKeyObj *)operator_new(0x50);
      P11DESSecretKeyObj::P11DESSecretKeyObj((P11DESSecretKeyObj *)this_00);
    }
    *p11object = (P11Object *)this_00;
    (*(this_00->super_P11SecretKeyObj).super_P11KeyObj.super_P11Object._vptr_P11Object[3])
              (this_00,keyType);
    goto LAB_00147e2c;
  default:
    goto switchD_00147bb8_caseD_5;
  case 6:
    if (keyType == 2) {
      this = (P11Object *)operator_new(0x48);
      P11DHDomainObj::P11DHDomainObj((P11DHDomainObj *)this);
    }
    else {
      if (keyType != 1) {
        return 0x13;
      }
      this = (P11Object *)operator_new(0x48);
      P11DSADomainObj::P11DSADomainObj((P11DSADomainObj *)this);
    }
  }
  *p11object = this;
LAB_00147e2c:
  CVar1 = 0;
switchD_00147bb8_caseD_5:
  return CVar1;
}

Assistant:

static CK_RV newP11Object(CK_OBJECT_CLASS objClass, CK_KEY_TYPE keyType, CK_CERTIFICATE_TYPE certType, P11Object **p11object)
{
	switch(objClass) {
		case CKO_DATA:
			*p11object = new P11DataObj();
			break;
		case CKO_CERTIFICATE:
			if (certType == CKC_X_509)
				*p11object = new P11X509CertificateObj();
			else if (certType == CKC_OPENPGP)
				*p11object = new P11OpenPGPPublicKeyObj();
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		case CKO_PUBLIC_KEY:
			if (keyType == CKK_RSA)
				*p11object = new P11RSAPublicKeyObj();
			else if (keyType == CKK_DSA)
				*p11object = new P11DSAPublicKeyObj();
			else if (keyType == CKK_EC)
				*p11object = new P11ECPublicKeyObj();
			else if (keyType == CKK_DH)
				*p11object = new P11DHPublicKeyObj();
			else if (keyType == CKK_GOSTR3410)
				*p11object = new P11GOSTPublicKeyObj();
			else if (keyType == CKK_EC_EDWARDS)
				*p11object = new P11EDPublicKeyObj();
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		case CKO_PRIVATE_KEY:
			// we need to know the type too
			if (keyType == CKK_RSA)
				*p11object = new P11RSAPrivateKeyObj();
			else if (keyType == CKK_DSA)
				*p11object = new P11DSAPrivateKeyObj();
			else if (keyType == CKK_EC)
				*p11object = new P11ECPrivateKeyObj();
			else if (keyType == CKK_DH)
				*p11object = new P11DHPrivateKeyObj();
			else if (keyType == CKK_GOSTR3410)
				*p11object = new P11GOSTPrivateKeyObj();
			else if (keyType == CKK_EC_EDWARDS)
				*p11object = new P11EDPrivateKeyObj();
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		case CKO_SECRET_KEY:
			if ((keyType == CKK_GENERIC_SECRET) ||
			    (keyType == CKK_MD5_HMAC) ||
			    (keyType == CKK_SHA_1_HMAC) ||
			    (keyType == CKK_SHA224_HMAC) ||
			    (keyType == CKK_SHA256_HMAC) ||
			    (keyType == CKK_SHA384_HMAC) ||
			    (keyType == CKK_SHA512_HMAC))
			{
				P11GenericSecretKeyObj* key = new P11GenericSecretKeyObj();
				*p11object = key;
				key->setKeyType(keyType);
			}
			else if (keyType == CKK_AES)
			{
				*p11object = new P11AESSecretKeyObj();
			}
			else if ((keyType == CKK_DES) ||
				 (keyType == CKK_DES2) ||
				 (keyType == CKK_DES3))
			{
				P11DESSecretKeyObj* key = new P11DESSecretKeyObj();
				*p11object = key;
				key->setKeyType(keyType);
			}
			else if (keyType == CKK_GOST28147)
			{
				*p11object = new P11GOSTSecretKeyObj();
			}
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		case CKO_DOMAIN_PARAMETERS:
			if (keyType == CKK_DSA)
				*p11object = new P11DSADomainObj();
			else if (keyType == CKK_DH)
				*p11object = new P11DHDomainObj();
			else
				return CKR_ATTRIBUTE_VALUE_INVALID;
			break;
		default:
			return CKR_ATTRIBUTE_VALUE_INVALID; // invalid value for a valid argument
	}
	return CKR_OK;
}